

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

string * __thiscall
cmsys::anon_unknown_3::SymbolProperties::GetFileName
          (string *__return_storage_ptr__,SymbolProperties *this,string *path)

{
  string *extraout_RAX;
  string *psVar1;
  string *extraout_RAX_00;
  long in_RCX;
  string *local_38 [2];
  _Alloc_hider local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,path,(long)&(path->_M_dataplus)._M_p + in_RCX);
  psVar1 = extraout_RAX;
  if (this->ReportPath == 0) {
    psVar1 = (string *)
             std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x501952,0xffffffffffffffff)
    ;
    if (psVar1 != (string *)0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
      psVar1 = (string *)&local_28;
      if (local_38[0] != psVar1) {
        operator_delete(local_38[0],(ulong)(local_28._M_p + 1));
        psVar1 = extraout_RAX_00;
      }
    }
  }
  return psVar1;
}

Assistant:

kwsys_stl::string SymbolProperties::GetFileName(const kwsys_stl::string &path) const
{
  kwsys_stl::string file(path);
  if (!this->ReportPath)
    {
    size_t at = file.rfind("/");
    if (at!=kwsys_stl::string::npos)
      {
      file = file.substr(at+1,kwsys_stl::string::npos);
      }
    }
  return file;
}